

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsignalspy.cpp
# Opt level: O3

void __thiscall QSignalSpy::QSignalSpy(QSignalSpy *this,ObjectSignal os)

{
  QList<int> *this_00;
  undefined1 *puVar1;
  QSignalSpyPrivate *pQVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  QMetaTypeInterface *pQVar6;
  QSignalSpyPrivate *this_01;
  undefined8 *puVar7;
  QList<QVariant> *pQVar8;
  long lVar9;
  long lVar10;
  undefined8 *puVar11;
  long in_FS_OFFSET;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 local_b4;
  char *local_b0;
  QList<QVariant> *local_a0;
  Data *local_88;
  Data *local_70;
  char local_60 [24];
  char *local_48;
  __atomic_base<int> local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QList<QList<QVariant>_>).d.size = 0;
  (this->d_ptr)._M_t.
  super___uniq_ptr_impl<QSignalSpyPrivate,_std::default_delete<QSignalSpyPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QSignalSpyPrivate_*,_std::default_delete<QSignalSpyPrivate>_>.
  super__Head_base<0UL,_QSignalSpyPrivate_*,_false>._M_head_impl = (QSignalSpyPrivate *)0x0;
  (this->super_QList<QList<QVariant>_>).d.d = (Data *)0x0;
  (this->super_QList<QList<QVariant>_>).d.ptr = (QList<QVariant> *)0x0;
  QMetaMethod::methodSignature();
  this_00 = &this->args;
  if (os.obj == (QObject *)0x0) {
    (this_00->d).d = (Data *)0x0;
    (this->args).d.ptr = (int *)0x0;
    (this->args).d.size = 0;
  }
  else {
    local_c8 = os.sig.mobj._0_4_;
    uStack_c4 = os.sig.mobj._4_4_;
    uStack_c0 = os.sig.data.d._0_4_;
    uStack_bc = os.sig.data.d._4_4_;
    (this_00->d).d = (Data *)0x0;
    (this->args).d.ptr = (int *)0x0;
    (this->args).d.size = 0;
    iVar4 = QMetaMethod::parameterCount();
    QList<int>::reserve(this_00,(long)iVar4);
    lVar10 = 8;
    for (lVar9 = 0; iVar4 = QMetaMethod::parameterCount(), lVar9 < iVar4; lVar9 = lVar9 + 1) {
      pQVar6 = (QMetaTypeInterface *)QMetaMethod::parameterMetaType((int)&local_c8);
      if (pQVar6 == (QMetaTypeInterface *)0x0) {
        local_60[0] = '\x02';
        local_60[1] = '\0';
        local_60[2] = '\0';
        local_60[3] = '\0';
        local_60._4_8_ = 0;
        local_60[0xc] = 0;
        local_60[0xd] = 0;
        local_60[0xe] = 0;
        local_60[0xf] = 0;
        local_60[0x10] = 0;
        local_60[0x11] = 0;
        local_60[0x12] = 0;
        local_60[0x13] = 0;
        local_60[0x14] = 0;
        local_60[0x15] = 0;
        local_60[0x16] = 0;
        local_60[0x17] = 0;
        local_48 = "default";
        QMetaMethod::parameterNames();
        puVar11 = *(undefined8 **)
                   ((long)&(local_70->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                   + lVar10);
        if (puVar11 == (undefined8 *)0x0) {
          puVar11 = &QByteArray::_empty;
        }
        QMetaMethod::parameterTypes();
        puVar7 = *(undefined8 **)
                  ((long)&(local_88->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                  lVar10);
        QMetaMethod::name();
        if (puVar7 == (undefined8 *)0x0) {
          puVar7 = &QByteArray::_empty;
        }
        pQVar8 = local_a0;
        if (local_a0 == (QList<QVariant> *)0x0) {
          pQVar8 = (QList<QVariant> *)&QByteArray::_empty;
        }
        QMessageLogger::warning
                  (local_60,
                   "QSignalSpy: Unable to handle parameter \'%s\' of type \'%s\' of method \'%s\', use qRegisterMetaType to register it."
                   ,puVar11,puVar7,pQVar8);
        QSignalSpy((QSignalSpy *)&stack0xffffffffffffff58);
        iVar4 = 0;
      }
      else {
        iVar4 = (pQVar6->typeId)._q_value.super___atomic_base<int>._M_i;
        if (iVar4 == 0) {
          iVar4 = QMetaType::registerHelper(pQVar6);
        }
      }
      local_3c._M_i = iVar4;
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)this_00,(this->args).d.size,&local_3c._M_i);
      QList<int>::end(this_00);
      lVar10 = lVar10 + 0x18;
    }
  }
  QObject::QObject(&(this->m_loop).super_QObject,(QObject *)0x0);
  *(undefined ***)&this->m_loop = &PTR_metaObject_0016eb58;
  (this->m_loop).loop = (QEventLoop *)0x0;
  (this->m_loop).timer.m_id = Invalid;
  puVar1 = &(this->m_loop).field_0x1c;
  *puVar1 = *puVar1 & 0xfe;
  this->m_waiting = false;
  (this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  if (os.obj == (QObject *)0x0) goto LAB_00123a66;
  this_01 = (QSignalSpyPrivate *)operator_new(0x18);
  QObject::QObject((QObject *)this_01,(QObject *)0x0);
  *(undefined ***)this_01 = &PTR_metaObject_0016f3c0;
  this_01->q = this;
  uVar5 = QMetaMethod::methodIndex();
  iVar4 = QMetaObject::methodCount();
  QMetaObject::connect
            ((QObject *)&local_c8,(int)os.obj,(QObject *)(ulong)uVar5,(int)this_01,iVar4,(int *)0x1)
  ;
  if (CONCAT44(uStack_c4,local_c8) == 0) {
    QMetaObject::Connection::~Connection((Connection *)&local_c8);
LAB_00123a2a:
    local_c8 = 2;
    uStack_c4 = 0;
    uStack_c0 = 0;
    uStack_bc = 0;
    uStack_b8 = 0;
    local_b4 = 0;
    local_b0 = "default";
    QMessageLogger::warning
              ((char *)&local_c8,
               "QSignalSpy: QMetaObject::connect returned false. Unable to connect.");
  }
  else {
    cVar3 = QMetaObject::Connection::isConnected_helper();
    QMetaObject::Connection::~Connection((Connection *)&local_c8);
    if (cVar3 == '\0') goto LAB_00123a2a;
    pQVar2 = (this->d_ptr)._M_t.
             super___uniq_ptr_impl<QSignalSpyPrivate,_std::default_delete<QSignalSpyPrivate>_>._M_t.
             super__Tuple_impl<0UL,_QSignalSpyPrivate_*,_std::default_delete<QSignalSpyPrivate>_>.
             super__Head_base<0UL,_QSignalSpyPrivate_*,_false>._M_head_impl;
    (this->d_ptr)._M_t.
    super___uniq_ptr_impl<QSignalSpyPrivate,_std::default_delete<QSignalSpyPrivate>_>._M_t.
    super__Tuple_impl<0UL,_QSignalSpyPrivate_*,_std::default_delete<QSignalSpyPrivate>_>.
    super__Head_base<0UL,_QSignalSpyPrivate_*,_false>._M_head_impl = this_01;
    this_01 = pQVar2;
    if (pQVar2 == (QSignalSpyPrivate *)0x0) goto LAB_00123a66;
  }
  (**(code **)(*(long *)this_01 + 0x20))(this_01);
LAB_00123a66:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QSignalSpy::QSignalSpy(ObjectSignal os)
    : sig(os.sig.methodSignature()),
      args(os.obj ? makeArgs(os.sig) : QList<int>{})
{
    if (!os.obj)
        return;

    auto i = std::make_unique<QSignalSpyPrivate>(this);

    const auto signalIndex = os.sig.methodIndex();
    const auto slotIndex = QObject::staticMetaObject.methodCount();
    if (!QMetaObject::connect(os.obj, signalIndex,
                              i.get(), slotIndex, Qt::DirectConnection)) {
        qWarning("QSignalSpy: QMetaObject::connect returned false. Unable to connect.");
        return;
    }

    d_ptr = std::move(i);
}